

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

bool __thiscall QFileInfo::isSymLink(QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  uint uVar1;
  bool bVar2;
  
  this_00 = (this->d_ptr).d.ptr;
  if ((*(uint *)&this_00->field_0x1d8 >> 0x1e & 1) == 0) {
    if ((this_00->fileEngine)._M_t.
        super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
        super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
        super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      if ((-1 < (int)*(uint *)&this_00->field_0x1d8) ||
         ((*(byte *)((long)&(this_00->metaData).knownFlagsMask.
                            super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2) & 1) == 0)
         ) {
        QFileSystemEngine::fillMetaData
                  (&this_00->fileEntry,&this_00->metaData,(MetaDataFlags)0x10000);
      }
      bVar2 = (bool)(*(byte *)((long)&(this_00->metaData).entryFlags.
                                      super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
                                      .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2)
                    & 1);
    }
    else {
      uVar1 = QFileInfoPrivate::getFileFlags(this_00,(FileFlags)0x10000);
      bVar2 = uVar1 != 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

constexpr P get() const noexcept { return ptr; }